

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O0

uint __thiscall pktalloc::CustomBitSet<64U>::FindFirstClear(CustomBitSet<64U> *this,uint bitStart)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  uint i;
  uint offset;
  WordT word;
  uint wordStart;
  uint bitStart_local;
  CustomBitSet<64U> *this_local;
  uint local_14;
  
  uVar3 = bitStart >> 6;
  uVar2 = (this[uVar3].Words[0] ^ 0xffffffffffffffff) >> ((byte)bitStart & 0x3f);
  if (uVar2 == 0) {
    while (uVar3 == 0xffffffff) {
      uVar2 = this->Words[0] ^ 0xffffffffffffffff;
      if (uVar2 != 0) {
        iVar4 = 0;
        for (uVar1 = uVar2; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
          iVar4 = iVar4 + 1;
        }
        iVar4 = iVar4 + 1;
        if (uVar2 == 0) {
          iVar4 = 0;
        }
        return iVar4 - 1;
      }
      uVar3 = 0;
    }
    local_14 = 0x40;
  }
  else {
    offset = 0;
    if ((uVar2 & 1) == 0) {
      iVar4 = 0;
      for (uVar1 = uVar2; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
        iVar4 = iVar4 + 1;
      }
      iVar4 = iVar4 + 1;
      if (uVar2 == 0) {
        iVar4 = 0;
      }
      offset = iVar4 - 1;
    }
    local_14 = bitStart + offset;
  }
  return local_14;
}

Assistant:

unsigned FindFirstClear(const unsigned bitStart)
    {
        static_assert(kWordBits == 64, "Update this");

        const unsigned wordStart = bitStart / kWordBits;

        WordT word = ~Words[wordStart] >> (bitStart % kWordBits);
        if (word != 0)
        {
            unsigned offset = 0;
            if ((word & 1) == 0) {
                offset = TrailingZeros64(word);
            }
            return bitStart + offset;
        }

        for (unsigned i = wordStart + 1; i < kWords; ++i)
        {
            word = ~Words[i];
            if (word != 0) {
                return i * kWordBits + TrailingZeros64(word);
            }
        }

        return kValidBits;
    }